

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unescape.cc
# Opt level: O3

uint32_t re2c::unesc_hex(char *s,char *s_end)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  
  uVar1 = 0;
  for (pcVar3 = s + 2; pcVar3 != s_end; pcVar3 = pcVar3 + 1) {
    iVar2 = -1;
    if ((byte)(*pcVar3 - 0x30U) < 0x37) {
      iVar2 = *(int *)(&DAT_0014d6d4 + (ulong)(byte)(*pcVar3 - 0x30U) * 4);
    }
    uVar1 = uVar1 * 0x10 + iVar2;
  }
  return uVar1;
}

Assistant:

uint32_t unesc_hex (const char * s, const char * s_end)
{
	uint32_t n = 0;
	for (s += 2; s != s_end; ++s)
	{
		n <<= 4;
		n += hex_digit (*s);
	}
	return n;
}